

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O1

boolean decode_mcu(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int iVar1;
  jpeg_entropy_decoder *pjVar2;
  int *piVar3;
  JBLOCKROW paJVar4;
  jpeg_component_info *pjVar5;
  jpeg_error_mgr *pjVar6;
  ushort uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  _func_boolean_j_decompress_ptr_JBLOCKROW_ptr *p_Var16;
  int *piVar17;
  uint uVar18;
  
  pjVar2 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    if (*(int *)((long)&pjVar2[4].start_pass + 4) == 0) {
      process_restart(cinfo);
    }
    piVar3 = (int *)((long)&pjVar2[4].start_pass + 4);
    *piVar3 = *piVar3 + -1;
  }
  if ((*(int *)&pjVar2[2].start_pass != -1) && (0 < cinfo->blocks_in_MCU)) {
    piVar3 = cinfo->natural_order;
    lVar14 = 0;
    do {
      paJVar4 = MCU_data[lVar14];
      lVar15 = (long)cinfo->MCU_membership[lVar14];
      pjVar5 = cinfo->cur_comp_info[lVar15];
      iVar1 = pjVar5->dc_tbl_no;
      p_Var16 = (&pjVar2[4].decode_mcu)[iVar1] +
                *(int *)((long)&pjVar2[3].start_pass + lVar15 * 4 + 4);
      iVar8 = arith_decode(cinfo,(uchar *)p_Var16);
      if (iVar8 == 0) {
        *(undefined4 *)((long)&pjVar2[3].start_pass + lVar15 * 4 + 4) = 0;
      }
      else {
        uVar9 = arith_decode(cinfo,(uchar *)(p_Var16 + 1));
        p_Var16 = p_Var16 + (ulong)uVar9 + 2;
        iVar8 = arith_decode(cinfo,(uchar *)p_Var16);
        uVar18 = 0;
        if (iVar8 != 0) {
          p_Var16 = (&pjVar2[4].decode_mcu)[iVar1] + 0x14;
          iVar8 = arith_decode(cinfo,(uchar *)p_Var16);
          uVar18 = 1;
          while (iVar8 != 0) {
            uVar18 = uVar18 * 2;
            if (uVar18 == 0x8000) {
LAB_00114614:
              pjVar6 = cinfo->err;
              pjVar6->msg_code = 0x75;
              (*pjVar6->emit_message)((j_common_ptr)cinfo,-1);
              *(undefined4 *)&pjVar2[2].start_pass = 0xffffffff;
              return 1;
            }
            p_Var16 = p_Var16 + 1;
            iVar8 = arith_decode(cinfo,(uchar *)p_Var16);
          }
        }
        iVar8 = 0;
        if ((int)((ulong)(1L << (cinfo->arith_dc_L[iVar1] & 0x3f)) >> 1) <= (int)uVar18) {
          if ((int)((ulong)(1L << (cinfo->arith_dc_U[iVar1] & 0x3f)) >> 1) < (int)uVar18) {
            iVar8 = uVar9 * 4 + 0xc;
          }
          else {
            iVar8 = uVar9 * 4 + 4;
          }
        }
        *(int *)((long)&pjVar2[3].start_pass + lVar15 * 4 + 4) = iVar8;
        uVar13 = uVar18;
        if (1 < uVar18) {
          do {
            uVar18 = (int)uVar18 >> 1;
            uVar10 = arith_decode(cinfo,(uchar *)(p_Var16 + 0xe));
            if (uVar10 != 0) {
              uVar10 = uVar18;
            }
            uVar13 = uVar13 | uVar10;
          } while (1 < uVar18);
        }
        uVar18 = ~uVar13;
        if (uVar9 == 0) {
          uVar18 = uVar13 + 1;
        }
        piVar17 = (int *)((long)&pjVar2[2].start_pass + lVar15 * 4 + 4);
        *piVar17 = *piVar17 + uVar18;
      }
      (*paJVar4)[0] = *(JCOEF *)((long)&pjVar2[2].start_pass + lVar15 * 4 + 4);
      if (cinfo->lim_Se != 0) {
        iVar1 = pjVar5->ac_tbl_no;
        iVar8 = 0;
        do {
          p_Var16 = (&pjVar2[0xc].decode_mcu)[iVar1];
          iVar11 = arith_decode(cinfo,(uchar *)(p_Var16 + iVar8 * 3));
          if (iVar11 != 0) break;
          p_Var16 = p_Var16 + (long)(iVar8 * 3) + 2;
          piVar17 = piVar3 + (iVar8 + 1);
          while (iVar11 = arith_decode(cinfo,(uchar *)(p_Var16 + -1)), iVar11 == 0) {
            iVar8 = iVar8 + 1;
            p_Var16 = p_Var16 + 3;
            piVar17 = piVar17 + 1;
            if (cinfo->lim_Se <= iVar8) goto LAB_00114614;
          }
          iVar11 = arith_decode(cinfo,(uchar *)&pjVar2[0x14].decode_mcu);
          iVar12 = arith_decode(cinfo,(uchar *)p_Var16);
          if (iVar12 == 0) {
            uVar18 = 0;
          }
          else {
            iVar12 = arith_decode(cinfo,(uchar *)p_Var16);
            if (iVar12 == 0) {
              uVar18 = 1;
            }
            else {
              lVar15 = 0xd9;
              if (iVar8 < (int)(uint)cinfo->arith_ac_K[iVar1]) {
                lVar15 = 0xbd;
              }
              p_Var16 = (&pjVar2[0xc].decode_mcu)[iVar1] + lVar15;
              iVar12 = arith_decode(cinfo,(uchar *)p_Var16);
              uVar18 = 2;
              while (iVar12 != 0) {
                uVar18 = uVar18 * 2;
                if (uVar18 == 0x8000) goto LAB_00114614;
                p_Var16 = p_Var16 + 1;
                iVar12 = arith_decode(cinfo,(uchar *)p_Var16);
              }
            }
          }
          uVar9 = uVar18;
          if (1 < uVar18) {
            do {
              uVar18 = (int)uVar18 >> 1;
              uVar13 = arith_decode(cinfo,(uchar *)(p_Var16 + 0xe));
              if (uVar13 != 0) {
                uVar13 = uVar18;
              }
              uVar9 = uVar9 | uVar13;
            } while (1 < uVar18);
          }
          iVar8 = iVar8 + 1;
          uVar7 = ~(ushort)uVar9;
          if (iVar11 == 0) {
            uVar7 = (ushort)uVar9 + 1;
          }
          (*paJVar4)[*piVar17] = uVar7;
        } while (iVar8 < cinfo->lim_Se);
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < cinfo->blocks_in_MCU);
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
decode_mcu (j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr) cinfo->entropy;
  jpeg_component_info * compptr;
  JBLOCKROW block;
  unsigned char *st;
  int blkn, ci, tbl, sign, k;
  int v, m;
  const int * natural_order;

  /* Process restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      process_restart(cinfo);
    entropy->restarts_to_go--;
  }

  if (entropy->ct == -1) return TRUE;	/* if error do nothing */

  natural_order = cinfo->natural_order;

  /* Outer loop handles each block in the MCU */

  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    block = MCU_data[blkn];
    ci = cinfo->MCU_membership[blkn];
    compptr = cinfo->cur_comp_info[ci];

    /* Sections F.2.4.1 & F.1.4.4.1: Decoding of DC coefficients */

    tbl = compptr->dc_tbl_no;

    /* Table F.4: Point to statistics bin S0 for DC coefficient coding */
    st = entropy->dc_stats[tbl] + entropy->dc_context[ci];

    /* Figure F.19: Decode_DC_DIFF */
    if (arith_decode(cinfo, st) == 0)
      entropy->dc_context[ci] = 0;
    else {
      /* Figure F.21: Decoding nonzero value v */
      /* Figure F.22: Decoding the sign of v */
      sign = arith_decode(cinfo, st + 1);
      st += 2; st += sign;
      /* Figure F.23: Decoding the magnitude category of v */
      if ((m = arith_decode(cinfo, st)) != 0) {
	st = entropy->dc_stats[tbl] + 20;	/* Table F.4: X1 = 20 */
	while (arith_decode(cinfo, st)) {
	  if ((m <<= 1) == 0x8000) {
	    WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
	    entropy->ct = -1;			/* magnitude overflow */
	    return TRUE;
	  }
	  st += 1;
	}
      }
      /* Section F.1.4.4.1.2: Establish dc_context conditioning category */
      if (m < (int) ((1L << cinfo->arith_dc_L[tbl]) >> 1))
	entropy->dc_context[ci] = 0;		   /* zero diff category */
      else if (m > (int) ((1L << cinfo->arith_dc_U[tbl]) >> 1))
	entropy->dc_context[ci] = 12 + (sign * 4); /* large diff category */
      else
	entropy->dc_context[ci] = 4 + (sign * 4);  /* small diff category */
      v = m;
      /* Figure F.24: Decoding the magnitude bit pattern of v */
      st += 14;
      while (m >>= 1)
	if (arith_decode(cinfo, st)) v |= m;
      v += 1; if (sign) v = -v;
      entropy->last_dc_val[ci] += v;
    }

    (*block)[0] = (JCOEF) entropy->last_dc_val[ci];

    /* Sections F.2.4.2 & F.1.4.4.2: Decoding of AC coefficients */

    if (cinfo->lim_Se == 0) continue;
    tbl = compptr->ac_tbl_no;
    k = 0;

    /* Figure F.20: Decode_AC_coefficients */
    do {
      st = entropy->ac_stats[tbl] + 3 * k;
      if (arith_decode(cinfo, st)) break;	/* EOB flag */
      for (;;) {
	k++;
	if (arith_decode(cinfo, st + 1)) break;
	st += 3;
	if (k >= cinfo->lim_Se) {
	  WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
	  entropy->ct = -1;			/* spectral overflow */
	  return TRUE;
	}
      }
      /* Figure F.21: Decoding nonzero value v */
      /* Figure F.22: Decoding the sign of v */
      sign = arith_decode(cinfo, entropy->fixed_bin);
      st += 2;
      /* Figure F.23: Decoding the magnitude category of v */
      if ((m = arith_decode(cinfo, st)) != 0) {
	if (arith_decode(cinfo, st)) {
	  m <<= 1;
	  st = entropy->ac_stats[tbl] +
	       (k <= cinfo->arith_ac_K[tbl] ? 189 : 217);
	  while (arith_decode(cinfo, st)) {
	    if ((m <<= 1) == 0x8000) {
	      WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
	      entropy->ct = -1;			/* magnitude overflow */
	      return TRUE;
	    }
	    st += 1;
	  }
	}
      }
      v = m;
      /* Figure F.24: Decoding the magnitude bit pattern of v */
      st += 14;
      while (m >>= 1)
	if (arith_decode(cinfo, st)) v |= m;
      v += 1; if (sign) v = -v;
      (*block)[natural_order[k]] = (JCOEF) v;
    } while (k < cinfo->lim_Se);
  }

  return TRUE;
}